

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O0

void __thiscall lts2::LBDOperator::drawSelfInImage(LBDOperator *this,Mat *destImage,int normalize)

{
  _InputArray *p_Var1;
  _InputOutputArray local_298;
  _InputArray local_280;
  _OutputArray local_268;
  _InputArray local_250;
  Mat local_238 [356];
  uint local_d4;
  Mat local_d0 [4];
  int i;
  Mat currentBasisVector;
  Scalar_<double> local_60;
  _InputArray local_40;
  Size_<int> local_24;
  int local_1c;
  _InputArray *p_Stack_18;
  int normalize_local;
  Mat *destImage_local;
  LBDOperator *this_local;
  
  local_1c = normalize;
  p_Stack_18 = (_InputArray *)destImage;
  destImage_local = (Mat *)this;
  cv::Size_<int>::Size_(&local_24,&this->_patchSize);
  cv::Mat::create(destImage,&local_24,5);
  p_Var1 = p_Stack_18;
  cv::Scalar_<double>::Scalar_(&local_60,0.0);
  cv::_InputArray::_InputArray<double,4,1>(&local_40,(Matx<double,_4,_1> *)&local_60);
  cv::noArray();
  cv::Mat::setTo(p_Var1,&local_40);
  cv::_InputArray::~_InputArray(&local_40);
  cv::Mat::Mat(local_d0);
  for (local_d4 = 0; local_d4 < *(uint *)&(this->super_LinearOperator).field_0xc;
      local_d4 = local_d4 + 1) {
    fillBasisFunctionForIndex(this,local_d0,local_d4);
    cv::abs(local_238);
    cv::Mat::operator=(local_d0,(MatExpr *)local_238);
    cv::MatExpr::~MatExpr((MatExpr *)local_238);
    if (0 < local_1c) {
      cv::_InputArray::_InputArray(&local_250,local_d0);
      cv::_OutputArray::_OutputArray(&local_268,local_d0);
      cv::threshold(&local_250,&local_268,0.0,1.0,0);
      cv::_OutputArray::~_OutputArray(&local_268);
      cv::_InputArray::~_InputArray(&local_250);
    }
    if (local_1c < 0) {
      cv::_InputArray::_InputArray(&local_280,local_d0);
      cv::_InputOutputArray::_InputOutputArray(&local_298,local_d0);
      p_Var1 = (_InputArray *)cv::noArray();
      cv::normalize(&local_280,&local_298,0.0,1.0,0x20,-1,p_Var1);
      cv::_InputOutputArray::~_InputOutputArray(&local_298);
      cv::_InputArray::~_InputArray(&local_280);
    }
    cv::operator+=((Mat *)p_Stack_18,local_d0);
  }
  cv::Mat::~Mat(local_d0);
  return;
}

Assistant:

void lts2::LBDOperator::drawSelfInImage(cv::Mat &destImage, int normalize) const
{
  destImage.create(_patchSize, CV_32FC1);
  destImage.setTo(cv::Scalar(0));

  cv::Mat currentBasisVector;
  for (int i = 0; i < _pairsInUse; ++i)
  {
    this->fillBasisFunctionForIndex(currentBasisVector, i);
    currentBasisVector = cv::abs(currentBasisVector);

    if (normalize > 0) cv::threshold(currentBasisVector, currentBasisVector, 0.0, 1.0, cv::THRESH_BINARY);
    if (normalize < 0) cv::normalize(currentBasisVector, currentBasisVector, 0.0, 1.0, cv::NORM_MINMAX);

    destImage += currentBasisVector;
  }
}